

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O3

void __thiscall CVmObjLookupTable::add_entry(CVmObjLookupTable *this,vm_val_t *key,vm_val_t *val)

{
  char *pcVar1;
  undefined8 *puVar2;
  ulong uVar3;
  anon_union_8_8_cb74652f_for_val aVar4;
  undefined4 uVar5;
  vm_val_t *pvVar6;
  uint uVar7;
  
  pvVar6 = sp_;
  uVar5 = *(undefined4 *)&key->field_0x4;
  aVar4 = key->val;
  sp_ = sp_ + 1;
  pvVar6->typ = key->typ;
  *(undefined4 *)&pvVar6->field_0x4 = uVar5;
  pvVar6->val = aVar4;
  pvVar6 = sp_;
  uVar5 = *(undefined4 *)&val->field_0x4;
  aVar4 = val->val;
  sp_ = sp_ + 1;
  pvVar6->typ = val->typ;
  *(undefined4 *)&pvVar6->field_0x4 = uVar5;
  pvVar6->val = aVar4;
  uVar7 = vm_val_t::calc_hash(key,0);
  uVar3 = (ulong)uVar7 % (ulong)*(uint *)(this->super_CVmObjCollection).super_CVmObject.ext_;
  expand_if_needed(this);
  pcVar1 = (this->super_CVmObjCollection).super_CVmObject.ext_;
  puVar2 = *(undefined8 **)(pcVar1 + 8);
  *(undefined8 *)(pcVar1 + 8) = puVar2[4];
  puVar2[4] = 0;
  puVar2[4] = *(undefined8 *)
               ((this->super_CVmObjCollection).super_CVmObject.ext_ + uVar3 * 8 + 0x20);
  *(undefined8 **)((this->super_CVmObjCollection).super_CVmObject.ext_ + uVar3 * 8 + 0x20) = puVar2;
  aVar4 = key->val;
  *puVar2 = *(undefined8 *)key;
  *(anon_union_8_8_cb74652f_for_val *)(puVar2 + 1) = aVar4;
  aVar4 = val->val;
  puVar2[2] = *(undefined8 *)val;
  *(anon_union_8_8_cb74652f_for_val *)(puVar2 + 3) = aVar4;
  sp_ = sp_ + -2;
  return;
}

Assistant:

void CVmObjLookupTable::add_entry(VMG_ 
                                  const vm_val_t *key, const vm_val_t *val)
{
    uint hashval;
    vm_lookup_val *entry;

    /* push the key and value as gc protection for a moment */
    G_stk->push(key);
    G_stk->push(val);
    
    /* calculate the hash value for the key */
    hashval = calc_key_hash(vmg_ key);

    /* allocate an entry */
    entry = alloc_new_entry(vmg0_);

    /* link this entry into the chain at this hash value */
    entry->nxt = get_ext()->buckets[hashval];
    get_ext()->buckets[hashval] = entry;

    /* set the key and value for this entry */
    entry->key = *key;
    entry->val = *val;

    /* discard the gc protection */
    G_stk->discard(2);
}